

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O2

void on_link_state_changed(void *context,LINK_STATE new_link_state,LINK_STATE previous_link_state)

{
  LINK_STATE LStack_20;
  
  if (new_link_state == LINK_STATE_DETACHED) {
    if (1 < *(int *)((long)context + 0x18) - 3U) {
      if (*(int *)((long)context + 0x18) == 1) {
        return;
      }
      LStack_20 = LINK_STATE_ERROR;
      new_link_state = LStack_20;
      goto LAB_00156fe1;
    }
  }
  else {
    if (new_link_state != LINK_STATE_ERROR) {
      if ((new_link_state != LINK_STATE_ATTACHED) || (*(int *)((long)context + 0x18) != 2)) {
        return;
      }
      LStack_20 = LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED;
      new_link_state = LStack_20;
      goto LAB_00156fe1;
    }
    if (*(int *)((long)context + 0x18) == 5) {
      return;
    }
  }
  indicate_all_messages_as_error((MESSAGE_SENDER_INSTANCE *)context);
LAB_00156fe1:
  set_message_sender_state((MESSAGE_SENDER_INSTANCE *)context,new_link_state);
  return;
}

Assistant:

static void on_link_state_changed(void* context, LINK_STATE new_link_state, LINK_STATE previous_link_state)
{
    MESSAGE_SENDER_INSTANCE* message_sender = (MESSAGE_SENDER_INSTANCE*)context;
    (void)previous_link_state;

    switch (new_link_state)
    {
    default:
        break;

    case LINK_STATE_ATTACHED:
        if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPENING)
        {
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_OPEN);
        }
        break;
    case LINK_STATE_DETACHED:
        if ((message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPEN) ||
            (message_sender->message_sender_state == MESSAGE_SENDER_STATE_CLOSING))
        {
            /* switch to closing so that no more requests should be accepted */
            indicate_all_messages_as_error(message_sender);
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_IDLE);
        }
        else if (message_sender->message_sender_state != MESSAGE_SENDER_STATE_IDLE)
        {
            /* Any other transition must be an error */
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
        }
        break;
    case LINK_STATE_ERROR:
        if (message_sender->message_sender_state != MESSAGE_SENDER_STATE_ERROR)
        {
            indicate_all_messages_as_error(message_sender);
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
        }
        break;
    }
}